

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void NV12ToRGB565Row_SSSE3
               (uint8_t *src_y,uint8_t *src_uv,uint8_t *dst_rgb565,YuvConstants *yuvconstants,
               int width)

{
  YuvConstants *in_RCX;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  int in_R8D;
  int twidth;
  uint8_t row [8192];
  int local_2068;
  uint8_t local_2060 [8204];
  int local_54;
  YuvConstants *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  for (local_54 = in_R8D; 0 < local_54; local_54 = local_54 - local_2068) {
    if (local_54 < 0x801) {
      local_2068 = local_54;
    }
    else {
      local_2068 = 0x800;
    }
    NV12ToARGBRow_SSSE3(local_38,local_40,local_2060,local_50,local_2068);
    ARGBToRGB565Row_SSE2(local_2060,local_48,local_2068);
    local_38 = local_38 + local_2068;
    local_40 = local_40 + local_2068;
    local_48 = local_48 + (local_2068 << 1);
  }
  return;
}

Assistant:

void NV12ToRGB565Row_SSSE3(const uint8_t* src_y,
                           const uint8_t* src_uv,
                           uint8_t* dst_rgb565,
                           const struct YuvConstants* yuvconstants,
                           int width) {
  // Row buffer for intermediate ARGB pixels.
  SIMD_ALIGNED(uint8_t row[MAXTWIDTH * 4]);
  while (width > 0) {
    int twidth = width > MAXTWIDTH ? MAXTWIDTH : width;
    NV12ToARGBRow_SSSE3(src_y, src_uv, row, yuvconstants, twidth);
    ARGBToRGB565Row_SSE2(row, dst_rgb565, twidth);
    src_y += twidth;
    src_uv += twidth;
    dst_rgb565 += twidth * 2;
    width -= twidth;
  }
}